

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  double dVar1;
  pointer pMVar2;
  pointer pFVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  undefined8 *puVar7;
  long lVar8;
  Index IVar9;
  undefined4 in_register_00000034;
  long lVar10;
  double *pdVar11;
  Index col_1;
  ulong uVar12;
  int iVar13;
  Index col;
  Index j;
  long lVar14;
  double *pdVar15;
  double dVar16;
  Mat p;
  Mat sol;
  ArrayZZ sum_invRp;
  Z dist;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  DenseStorage<double,__1,__1,__1,_0> local_f8;
  ulong local_e0;
  Mat *local_d8;
  double local_d0;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_c8;
  pointer local_b0;
  XprType local_a8;
  Mat local_60;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_48;
  
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  lVar10 = (long)this->M;
  lVar8 = (long)this->nInvSolFound;
  if ((lVar8 != 0 && lVar10 != 0) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816(lVar8),0) < lVar10)) {
    puVar7 = (undefined8 *)
             __cxa_allocate_exception
                       (8,CONCAT44(in_register_00000034,newSol1),SUB168(auVar5 % SEXT816(lVar8),0));
    *puVar7 = operator_delete;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,lVar8 * lVar10,lVar10,lVar8);
  local_f8.m_data = (double *)0x0;
  local_f8.m_rows = 0;
  local_f8.m_cols = 0;
  lVar8 = (long)this->nInvSolFound;
  if ((lVar8 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar8),0) < 1)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = operator_delete;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_f8,lVar8,1,lVar8);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_c8,(long)this->nInvSolFound,&this->zeroZZ,(allocator_type *)&local_b0);
  uVar6 = this->nInvSolFound - 1;
  if (1 < this->nInvSolFound) {
    pMVar2 = (this->invPredictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    pdVar11 = local_f8.m_data;
    do {
      if (0 < local_f8.m_rows) {
        lVar8 = 0;
        do {
          pdVar11[lVar8] =
               (double)pMVar2[uVar12].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                       m_storage;
          lVar8 = lVar8 + 1;
        } while (local_f8.m_rows != lVar8);
      }
      uVar12 = uVar12 + 1;
      pdVar11 = pdVar11 + local_f8.m_rows;
    } while (uVar12 != uVar6);
  }
  pFVar3 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < local_f8.m_rows) {
    lVar8 = 0;
    do {
      local_f8.m_data[worseSol * local_f8.m_rows + lVar8] =
           (double)pFVar3[newSol1].super_LinearExpert<1,_1>.pred_z.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
      lVar8 = lVar8 + 1;
    } while (local_f8.m_rows != lVar8);
  }
  if (0 < local_f8.m_rows) {
    lVar8 = 0;
    do {
      local_f8.m_data[(int)uVar6 * local_f8.m_rows + lVar8] =
           (double)pFVar3[newSol2].super_LinearExpert<1,_1>.pred_z.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
      lVar8 = lVar8 + 1;
    } while (local_f8.m_rows != lVar8);
  }
  if (0 < (this->param).iterMax) {
    local_d8 = &this->invRzj;
    uVar12 = 0;
    do {
      local_e0 = uVar12;
      if (0 < this->M) {
        lVar10 = 0;
        lVar8 = 0;
        do {
          uVar6 = this->nInvSolFound;
          if (0 < (int)uVar6) {
            lVar14 = 0;
            do {
              local_a8.m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
              m_data = (PointerType)
                       ((long)&local_a8.m_rhs.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                       + 8);
              local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)
                       ((double)(this->experts).
                                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                .
                                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                super_LinearExpert<1,_1>.pred_z.
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                m_storage - local_f8.m_data[local_f8.m_rows * lVar14]);
              local_a8.m_lhs = &local_60;
              dVar16 = exp(((double)(this->iInvRj).
                                    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                    .
                                    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                    m_storage *
                            (double)local_60.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data *
                            (double)local_60.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data * -0.5) / this->sumAll);
              local_118.m_data[local_118.m_rows * lVar14 + lVar8] = dVar16;
              lVar14 = lVar14 + 1;
              uVar6 = this->nInvSolFound;
            } while (lVar14 < (int)uVar6);
          }
          if (local_118.m_cols == 0) {
            dVar16 = 0.0;
          }
          else {
            dVar16 = local_118.m_data[lVar8];
            if (1 < local_118.m_cols) {
              lVar14 = local_118.m_cols + -1;
              pdVar11 = (double *)(lVar10 + local_118.m_rows * 8 + (long)local_118.m_data);
              do {
                dVar16 = dVar16 + *pdVar11;
                pdVar11 = pdVar11 + local_118.m_rows;
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
            }
          }
          if ((0.0 < dVar16) && (0 < local_118.m_cols)) {
            pdVar11 = (double *)((long)local_118.m_data + lVar10);
            IVar9 = local_118.m_cols;
            do {
              *pdVar11 = *pdVar11 / dVar16;
              pdVar11 = pdVar11 + local_118.m_rows;
              IVar9 = IVar9 + -1;
            } while (IVar9 != 0);
          }
          if (0 < (int)uVar6) {
            pMVar2 = (this->iInvRj).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)((long)local_118.m_data + lVar10);
            uVar12 = 0;
            do {
              local_c8.
              super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12].
              super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
                   = *pdVar11 *
                     (double)pMVar2[lVar8].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage
                     + local_c8.
                       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
                       .array[0];
              uVar12 = uVar12 + 1;
              pdVar11 = pdVar11 + local_118.m_rows;
            } while (uVar6 != uVar12);
          }
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 8;
        } while (lVar8 < this->M);
      }
      if (0 < this->nInvSolFound) {
        lVar8 = 0;
        do {
          IVar9 = local_f8.m_rows;
          pdVar11 = local_f8.m_data;
          local_a8.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_data = local_118.m_data + local_118.m_rows * lVar8;
          local_b0 = local_c8.
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar8;
          local_a8.m_lhs = local_d8;
          local_a8.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value = local_118.m_rows;
          local_a8.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startRow.m_value = 0;
          local_a8.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_outerStride = local_118.m_rows;
          local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
               = (Index)&local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols;
          local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
               = (Index)(1.0 / (local_b0->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                               m_storage.m_data.array[0]);
          local_a8.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
               (XprTypeNested)&local_118;
          local_a8.m_rhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startCol.m_value = lVar8;
          Eigen::internal::
          product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          ::product_evaluator(&local_48,&local_a8);
          local_d0 = *(double *)
                      local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows *
                     *(double *)
                      local_48.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      .m_d.data;
          free(local_48.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
          pdVar11[IVar9 * lVar8] = local_d0;
          local_c8.
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar8].
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
               0.0;
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->nInvSolFound);
      }
      uVar6 = (int)local_e0 + 1;
      uVar12 = (ulong)uVar6;
    } while ((int)uVar6 < (this->param).iterMax);
  }
  if (0 < this->M) {
    piVar4 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    pdVar11 = local_118.m_data + local_118.m_rows;
    do {
      iVar13 = -(uint)(local_118.m_cols == 0);
      if (1 < local_118.m_cols) {
        dVar16 = local_118.m_data[lVar8];
        lVar14 = 1;
        lVar10 = 0;
        pdVar15 = pdVar11;
        do {
          dVar1 = *pdVar15;
          if (dVar16 < dVar1) {
            lVar10 = lVar14;
          }
          iVar13 = (int)lVar10;
          if (dVar1 <= dVar16) {
            dVar1 = dVar16;
          }
          dVar16 = dVar1;
          lVar14 = lVar14 + 1;
          pdVar15 = pdVar15 + local_118.m_rows;
        } while (local_118.m_cols != lVar14);
      }
      piVar4[lVar8] = iVar13;
      lVar8 = lVar8 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar8 < this->M);
  }
  if (local_c8.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_c8.
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  free(local_f8.m_data);
  free(local_118.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}